

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ArrayFeatureType_ShapeRange * __thiscall
CoreML::Specification::ArrayFeatureType::_internal_mutable_shaperange(ArrayFeatureType *this)

{
  bool bVar1;
  Arena *arena;
  ArrayFeatureType_ShapeRange *pAVar2;
  ArrayFeatureType *this_local;
  
  bVar1 = _internal_has_shaperange(this);
  if (!bVar1) {
    clear_ShapeFlexibility(this);
    set_has_shaperange(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(arena);
    (this->ShapeFlexibility_).shaperange_ = pAVar2;
  }
  return (ArrayFeatureType_ShapeRange *)(this->ShapeFlexibility_).enumeratedshapes_;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_ShapeRange* ArrayFeatureType::_internal_mutable_shaperange() {
  if (!_internal_has_shaperange()) {
    clear_ShapeFlexibility();
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = CreateMaybeMessage< ::CoreML::Specification::ArrayFeatureType_ShapeRange >(GetArenaForAllocation());
  }
  return ShapeFlexibility_.shaperange_;
}